

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  uint8 uVar6;
  uint8 uVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  
  iVar8 = pD->m_eob_run;
  if (iVar8 == 0) {
    iVar8 = pD->m_spectral_start;
    if (iVar8 <= pD->m_spectral_end) {
      pcVar3 = pD->m_ac_coeffs[component_id];
      iVar1 = pcVar3->block_size;
      puVar4 = pcVar3->pData;
      iVar2 = pcVar3->block_num_x;
      do {
        uVar9 = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);
        iVar13 = (int)uVar9 >> 4;
        uVar11 = uVar9 & 0xf;
        if (uVar11 == 0) {
          if (iVar13 != 0xf) {
            bVar10 = (byte)iVar13;
            pD->m_eob_run = 1 << (bVar10 & 0x1f);
            if (0xf < uVar9) {
              uVar9 = pD->m_bit_buf;
              iVar8 = pD->m_bits_left;
              pD->m_bits_left = iVar8 - iVar13;
              if (iVar8 - iVar13 == 0 || iVar8 < iVar13) {
                uVar11 = uVar9 << ((byte)iVar8 & 0x1f);
                pD->m_bit_buf = uVar11;
                if (pD->m_in_buf_left < 2) {
LAB_00123492:
                  uVar6 = get_octet(pD);
                  uVar7 = get_octet(pD);
                  pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar6,uVar7);
                }
                else {
                  puVar4 = pD->m_pIn_buf_ofs;
                  if ((*puVar4 == 0xff) || (puVar4[1] == 0xff)) goto LAB_00123492;
                  pD->m_bit_buf = CONCAT11(*puVar4,puVar4[1]) | uVar11;
                  pD->m_in_buf_left = pD->m_in_buf_left + -2;
                  pD->m_pIn_buf_ofs = puVar4 + 2;
                }
                pD->m_bit_buf = pD->m_bit_buf << (-(char)pD->m_bits_left & 0x1fU);
                pD->m_bits_left = pD->m_bits_left + 0x10;
              }
              else {
                pD->m_bit_buf = uVar9 << (bVar10 & 0x1f);
              }
              pD->m_eob_run = pD->m_eob_run + (uVar9 >> (-bVar10 & 0x1f));
            }
            iVar8 = pD->m_eob_run;
            goto LAB_00123234;
          }
          if (0x30 < iVar8) goto LAB_001234e1;
          iVar13 = iVar8 + 0xf;
        }
        else {
          iVar13 = iVar13 + iVar8;
          if (0x3f < iVar13) {
LAB_001234e1:
            stop_decoding(pD,JPGD_DECODE_ERROR);
          }
          uVar9 = pD->m_bit_buf;
          uVar12 = uVar9 >> (-(sbyte)uVar11 & 0x1fU);
          iVar8 = pD->m_bits_left;
          pD->m_bits_left = iVar8 - uVar11;
          if (iVar8 - uVar11 == 0 || iVar8 < (int)uVar11) {
            uVar9 = uVar9 << ((byte)iVar8 & 0x1f);
            pD->m_bit_buf = uVar9;
            if (pD->m_in_buf_left < 2) {
LAB_00123355:
              uVar6 = get_octet(pD);
              uVar7 = get_octet(pD);
              pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar6,uVar7);
            }
            else {
              puVar5 = pD->m_pIn_buf_ofs;
              if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_00123355;
              pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar9;
              pD->m_in_buf_left = pD->m_in_buf_left + -2;
              pD->m_pIn_buf_ofs = puVar5 + 2;
            }
            pD->m_bit_buf = pD->m_bit_buf << (-(char)pD->m_bits_left & 0x1fU);
            pD->m_bits_left = pD->m_bits_left + 0x10;
          }
          else {
            pD->m_bit_buf = uVar9 << (sbyte)uVar11;
          }
          if ((int)uVar12 < *(int *)(s_extend_test + (ulong)uVar11 * 4)) {
            uVar12 = uVar12 + *(int *)(s_extend_offset + (ulong)uVar11 * 4);
          }
          *(short *)(puVar4 + (long)(int)(&g_ZAG)[iVar13] * 2 +
                              (long)(block_y * iVar1 * iVar2) + (long)(block_x * iVar1)) =
               (short)(uVar12 << ((byte)pD->m_successive_low & 0x1f));
        }
        iVar8 = iVar13 + 1;
      } while (iVar13 < pD->m_spectral_end);
    }
  }
  else {
LAB_00123234:
    pD->m_eob_run = iVar8 + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int k, s, r;

  if (pD->m_eob_run) {
    pD->m_eob_run--;
    return;
  }

  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

  for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++) {
    s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

    r = s >> 4;
    s &= 15;

    if (s) {
      if ((k += r) > 63)
        pD->stop_decoding(JPGD_DECODE_ERROR);

      r = pD->get_bits_no_markers(s);
      s = JPGD_HUFF_EXTEND(r, s);

      p[g_ZAG[k]] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
    } else {
      if (r == 15) {
        if ((k += 15) > 63)
          pD->stop_decoding(JPGD_DECODE_ERROR);
      } else {
        pD->m_eob_run = 1 << r;

        if (r)
          pD->m_eob_run += pD->get_bits_no_markers(r);

        pD->m_eob_run--;

        break;
      }
    }
  }
}